

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIDManifest.cpp
# Opt level: O0

void __thiscall
Imf_3_3::CompressedIDManifest::CompressedIDManifest(CompressedIDManifest *this,IDManifest *manifest)

{
  exr_result_t eVar1;
  size_type sVar2;
  void *pvVar3;
  void *pvVar4;
  undefined8 uVar5;
  undefined4 *in_RDI;
  size_t compressedDataSize;
  size_t compressedBufferSize;
  size_t outputSize;
  vector<char,_std::allocator<char>_> serial;
  vector<char,_std::allocator<char>_> *in_stack_000004c8;
  IDManifest *in_stack_000004d0;
  char *text;
  InputExc *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  undefined1 *out;
  size_t in_stack_ffffffffffffffb0;
  exr_const_context_t in_stack_ffffffffffffffc8;
  undefined1 local_28 [8];
  size_t *in_stack_ffffffffffffffe0;
  
  out = local_28;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0xb9d840);
  IDManifest::serialize(in_stack_000004d0,in_stack_000004c8);
  sVar2 = std::vector<char,_std::allocator<char>_>::size
                    ((vector<char,_std::allocator<char>_> *)local_28);
  pvVar3 = (void *)exr_compress_max_buffer_size(in_stack_ffffffffffffff98);
  pvVar4 = malloc((size_t)pvVar3);
  *(void **)(in_RDI + 4) = pvVar4;
  std::vector<char,_std::allocator<char>_>::data((vector<char,_std::allocator<char>_> *)0xb9d89b);
  text = &stack0xffffffffffffffb0;
  eVar1 = exr_compress_buffer(in_stack_ffffffffffffffc8,(int)(sVar2 >> 0x20),pvVar3,
                              in_stack_ffffffffffffffb0,out,(size_t)in_RDI,in_stack_ffffffffffffffe0
                             );
  if (eVar1 != 0) {
    uVar5 = __cxa_allocate_exception(0x48);
    Iex_3_3::InputExc::InputExc(in_stack_ffffffffffffff80,text);
    __cxa_throw(uVar5,&Iex_3_3::InputExc::typeinfo,Iex_3_3::InputExc::~InputExc);
  }
  pvVar3 = realloc(*(void **)(in_RDI + 4),in_stack_ffffffffffffffb0);
  *(void **)(in_RDI + 4) = pvVar3;
  *(size_type *)(in_RDI + 2) = sVar2;
  *in_RDI = (int)in_stack_ffffffffffffffb0;
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)CONCAT44(eVar1,in_stack_ffffffffffffff90));
  return;
}

Assistant:

CompressedIDManifest::CompressedIDManifest (const IDManifest& manifest)
{
    //
    // make a compressed copy of the manifest by serializing the data into contiguous memory,
    // then calling zlib to compress
    //

    std::vector<char> serial;

    manifest.serialize (serial);

    size_t outputSize = serial.size ();

    //
    // allocate a buffer which is guaranteed to be big enough for compression
    //
    size_t compressedBufferSize = exr_compress_max_buffer_size (outputSize);
    size_t compressedDataSize;
    _data = (unsigned char*) malloc (compressedBufferSize);
    if (EXR_ERR_SUCCESS != exr_compress_buffer (
                               nullptr,
                               -1,
                               serial.data (),
                               outputSize,
                               _data,
                               compressedBufferSize,
                               &compressedDataSize))
    {
        throw IEX_NAMESPACE::InputExc ("ID manifest compression failed");
    }

    // now call realloc to reallocate the buffer to a smaller size - this might free up memory
    _data = (unsigned char*) realloc (_data, compressedDataSize);

    _uncompressedDataSize = outputSize;
    _compressedDataSize   = compressedDataSize;
}